

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

size_t mg_str_append(char **dst,char *end,char *src)

{
  char *__dest;
  size_t sVar1;
  
  sVar1 = strlen(src);
  __dest = *dst;
  if (__dest != end) {
    if (sVar1 < (ulong)((long)end - (long)__dest)) {
      strcpy(__dest,src);
      end = *dst + sVar1;
    }
    *dst = end;
  }
  return sVar1;
}

Assistant:

static size_t
mg_str_append(char **dst, char *end, const char *src)
{
	size_t len = strlen(src);
	if (*dst != end) {
		/* Append src if enough space, or close dst. */
		if ((size_t)(end - *dst) > len) {
			strcpy(*dst, src);
			*dst += len;
		} else {
			*dst = end;
		}
	}
	return len;
}